

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>_>::readValueFrom
          (TypedAttribute<Imath_3_2::Vec3<double>_> *this,IStream *is,int size,int version)

{
  uchar b [8];
  double local_20;
  
  (*is->_vptr_IStream[3])(is,&local_20,8);
  (this->_value).x = local_20;
  (*is->_vptr_IStream[3])(is,&local_20,8);
  (this->_value).y = local_20;
  (*is->_vptr_IStream[3])(is,&local_20,8);
  (this->_value).z = local_20;
  return;
}

Assistant:

IMF_EXPORT void
V3dAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.x);
    Xdr::read<StreamIO> (is, _value.y);
    Xdr::read<StreamIO> (is, _value.z);
}